

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

void __thiscall QHttpHeaders::removeAll(QHttpHeaders *this,QAnyStringView name)

{
  long lVar1;
  bool bVar2;
  HeaderName *in_RDI;
  long in_FS_OFFSET;
  HeaderName *in_stack_00000010;
  Self *in_stack_00000018;
  QAnyStringView in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isEmpty((QHttpHeaders *)0x1c7a43);
  if (!bVar2) {
    HeaderName::HeaderName(in_RDI,in_stack_ffffffffffffffe8);
    QHttpHeadersPrivate::removeAll(in_stack_00000018,in_stack_00000010);
    HeaderName::~HeaderName((HeaderName *)0x1c7a8b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpHeaders::removeAll(QAnyStringView name)
{
    if (isEmpty())
        return;

    return QHttpHeadersPrivate::removeAll(d, HeaderName(name));
}